

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::value(KeyFrames<float,_void> *this,int frameNo)

{
  Frame *pFVar1;
  Frame *keyFrame;
  Frame *this_00;
  float fVar2;
  float fVar3;
  
  fVar3 = (float)frameNo;
  this_00 = (this->frames_).
            super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start;
  fVar2 = this_00->start_;
  if (fVar3 <= fVar2) {
    fVar2 = (this_00->value_).start_;
  }
  else {
    pFVar1 = (this->frames_).
             super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar1[-1].end_ <= fVar3) {
      fVar2 = pFVar1[-1].value_.end_;
    }
    else {
      for (; this_00 != pFVar1; this_00 = this_00 + 1) {
        if (fVar3 < this_00->end_ && this_00->start_ <= fVar3) {
          fVar2 = Frame::value(this_00,frameNo);
          break;
        }
      }
      if (this_00 == pFVar1) {
        fVar2 = 0.0;
      }
    }
  }
  return fVar2;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }